

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O0

int __thiscall QtMWidgets::MessageBoxPrivate::init(MessageBoxPrivate *this,EVP_PKEY_CTX *ctx)

{
  MessageBox *pMVar1;
  QWidget *pQVar2;
  int iVar3;
  QVBoxLayout *pQVar4;
  QFrame *pQVar5;
  MsgBoxTitle *pMVar6;
  ScrollArea *pSVar7;
  TextLabel *pTVar8;
  QPalette *this_00;
  QColor *c;
  QHBoxLayout *this_01;
  MsgBoxButton *pMVar9;
  QVBoxLayout *in_RDX;
  QFlags<Qt::AlignmentFlag> local_94;
  iterator local_90;
  ButtonRole local_84;
  MsgBoxButton *local_80;
  undefined1 local_71;
  QString local_70;
  QFlags<Qt::AlignmentFlag> local_58;
  QFlags<Qt::WindowType> local_54;
  QFlags<Qt::AlignmentFlag> local_50;
  WindowFlags local_4c;
  QFlags<Qt::AlignmentFlag> local_48;
  QFlags<Qt::WindowType> local_44;
  QFlags<Qt::AlignmentFlag> local_40;
  QFlags<Qt::AlignmentFlag> local_3c;
  QFlags<Qt::WindowType> local_38 [4];
  QVBoxLayout *local_28;
  QVBoxLayout *layout;
  QString *txt_local;
  QString *titl_local;
  MessageBoxPrivate *this_local;
  
  layout = in_RDX;
  txt_local = (QString *)ctx;
  titl_local = (QString *)this;
  QDialog::setModal(SUB81(this->q,0));
  pQVar4 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar4,(QWidget *)this->q);
  local_28 = pQVar4;
  QLayout::setContentsMargins((int)pQVar4,0,0,0);
  pQVar5 = (QFrame *)operator_new(0x28);
  pMVar1 = this->q;
  QFlags<Qt::WindowType>::QFlags(local_38);
  QFrame::QFrame(pQVar5,(QWidget *)pMVar1,(QFlags_conflict1 *)(ulong)local_38[0].i);
  this->frame = pQVar5;
  QFrame::setFrameStyle((int)this->frame);
  pQVar4 = local_28;
  pQVar5 = this->frame;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_3c);
  QBoxLayout::addWidget((QWidget *)pQVar4,(int)pQVar5,(QFlags_conflict1 *)0x0);
  pQVar4 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar4,(QWidget *)this->frame);
  this->vbox = pQVar4;
  (**(code **)(*(long *)this->vbox + 0x68))(this->vbox,0);
  QLayout::setContentsMargins((int)this->vbox,3,3,3);
  pMVar6 = (MsgBoxTitle *)operator_new(0x30);
  MsgBoxTitle::MsgBoxTitle(pMVar6,txt_local,(QWidget *)this->frame);
  this->title = pMVar6;
  pQVar2 = (QWidget *)this->vbox;
  pMVar6 = this->title;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_40);
  QBoxLayout::addWidget(pQVar2,(int)pMVar6,(QFlags_conflict1 *)0x0);
  pQVar5 = (QFrame *)operator_new(0x28);
  pQVar2 = (QWidget *)this->frame;
  QFlags<Qt::WindowType>::QFlags(&local_44);
  QFrame::QFrame(pQVar5,pQVar2,(QFlags_conflict1 *)(ulong)local_44.i);
  this->h1 = pQVar5;
  QFrame::setFrameStyle((int)this->h1);
  pQVar2 = (QWidget *)this->vbox;
  pQVar5 = this->h1;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_48);
  QBoxLayout::addWidget(pQVar2,(int)pQVar5,(QFlags_conflict1 *)0x0);
  pSVar7 = (ScrollArea *)operator_new(0x30);
  ScrollArea::ScrollArea(pSVar7,(QWidget *)this->frame);
  this->scrollArea = pSVar7;
  ScrollArea::setWidgetResizable(this->scrollArea,true);
  pTVar8 = (TextLabel *)operator_new(0x30);
  pQVar2 = (QWidget *)this->frame;
  QFlags<Qt::WindowType>::QFlags(&local_4c);
  TextLabel::TextLabel(pTVar8,pQVar2,local_4c);
  this->textLabel = pTVar8;
  QWidget::setBackgroundRole((ColorRole)this->textLabel);
  pTVar8 = this->textLabel;
  this_00 = (QPalette *)QWidget::palette();
  c = QPalette::color(this_00,WindowText);
  TextLabel::setColor(pTVar8,c);
  QWidget::setAutoFillBackground(SUB81(this->textLabel,0));
  TextLabel::setText(this->textLabel,(QString *)layout);
  ScrollArea::setWidget(this->scrollArea,(QWidget *)this->textLabel);
  pQVar2 = (QWidget *)this->vbox;
  pSVar7 = this->scrollArea;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_50);
  QBoxLayout::addWidget(pQVar2,(int)pSVar7,(QFlags_conflict1 *)0x0);
  pQVar5 = (QFrame *)operator_new(0x28);
  pQVar2 = (QWidget *)this->frame;
  QFlags<Qt::WindowType>::QFlags(&local_54);
  QFrame::QFrame(pQVar5,pQVar2,(QFlags_conflict1 *)(ulong)local_54.i);
  this->h2 = pQVar5;
  QFrame::setFrameStyle((int)this->h2);
  pQVar2 = (QWidget *)this->vbox;
  pQVar5 = this->h2;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_58);
  QBoxLayout::addWidget(pQVar2,(int)pQVar5,(QFlags_conflict1 *)0x0);
  this_01 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(this_01);
  this->hbox = this_01;
  (**(code **)(*(long *)this->hbox + 0x68))();
  QLayout::setContentsMargins((int)this->hbox,0,0,0);
  pMVar9 = (MsgBoxButton *)operator_new(0x30);
  local_71 = 1;
  QObject::tr(&local_70,"OK",(char *)0x0,-1);
  MsgBoxButton::MsgBoxButton(pMVar9,&local_70,(QWidget *)this->frame);
  local_71 = 0;
  this->okButton = pMVar9;
  QString::~QString(&local_70);
  local_80 = this->okButton;
  local_84 = AcceptRole;
  local_90._M_node =
       (_Base_ptr)
       QMap<QAbstractButton_*,_QtMWidgets::MessageBox::ButtonRole>::insert
                 (&this->buttonsMap,(QAbstractButton **)&local_80,&local_84);
  QList<QAbstractButton_*>::append(&this->buttons,&this->okButton->super_QAbstractButton);
  pQVar2 = (QWidget *)this->hbox;
  pMVar9 = this->okButton;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_94);
  QBoxLayout::addWidget(pQVar2,(int)pMVar9,(QFlags_conflict1 *)0x0);
  QBoxLayout::addLayout((QLayout *)this->vbox,(int)this->hbox);
  pMVar1 = this->q;
  (**(code **)(*(long *)this->vbox + 0xf0))();
  iVar3 = QWidget::resize((QSize *)pMVar1);
  return iVar3;
}

Assistant:

void
MessageBoxPrivate::init( const QString & titl, const QString & txt )
{
	q->setModal( true );

	QVBoxLayout * layout = new QVBoxLayout( q );
	layout->setContentsMargins( 0, 0, 0, 0 );

	frame = new QFrame( q );
	frame->setFrameStyle( QFrame::Box | QFrame::Plain );
	layout->addWidget( frame );

	vbox = new QVBoxLayout( frame );
	vbox->setSpacing( 0 );
	vbox->setContentsMargins( 3, 3, 3, 3 );

	title = new MsgBoxTitle( titl, frame );
	vbox->addWidget( title );

	h1 = new QFrame( frame );
	h1->setFrameStyle( QFrame::HLine | QFrame::Sunken );
	vbox->addWidget( h1 );

	scrollArea = new ScrollArea( frame );
	scrollArea->setWidgetResizable( true );

	textLabel = new TextLabel( frame );
	textLabel->setBackgroundRole( QPalette::Window );
    textLabel->setColor( q->palette().color( QPalette::WindowText ) );
	textLabel->setAutoFillBackground( true );
	textLabel->setText( txt );
	scrollArea->setWidget( textLabel );

	vbox->addWidget( scrollArea );

	h2 = new QFrame( frame );
	h2->setFrameStyle( QFrame::HLine | QFrame::Sunken );
	vbox->addWidget( h2 );

	hbox = new QHBoxLayout;
	hbox->setSpacing( 0 );
	hbox->setContentsMargins( 0, 0, 0, 0 );

	okButton = new MsgBoxButton( QObject::tr( "OK" ), frame );
	buttonsMap.insert( okButton, MessageBox::AcceptRole );
	buttons.append( okButton );
	hbox->addWidget( okButton );

	vbox->addLayout( hbox );

	q->resize( vbox->sizeHint() );
}